

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

int32_t __thiscall icu_63::Calendar::getLocalDOW(Calendar *this)

{
  UCalendarDateFields UVar1;
  int32_t iVar2;
  int local_14;
  int32_t dowLocal;
  Calendar *this_local;
  
  local_14 = 0;
  UVar1 = resolveFields(this,(UFieldResolutionTable *)kDOWPrecedence);
  if (UVar1 == UCAL_DAY_OF_WEEK) {
    iVar2 = internalGet(this,UCAL_DAY_OF_WEEK);
    local_14 = iVar2 - this->fFirstDayOfWeek;
  }
  else if (UVar1 == UCAL_DOW_LOCAL) {
    iVar2 = internalGet(this,UCAL_DOW_LOCAL);
    local_14 = iVar2 + -1;
  }
  local_14 = local_14 % 7;
  if (local_14 < 0) {
    local_14 = local_14 + 7;
  }
  return local_14;
}

Assistant:

int32_t Calendar::getLocalDOW()
{
  // Get zero-based localized DOW, valid range 0..6.  This is the DOW
    // we are looking for.
    int32_t dowLocal = 0;
    switch (resolveFields(kDOWPrecedence)) {
    case UCAL_DAY_OF_WEEK:
        dowLocal = internalGet(UCAL_DAY_OF_WEEK) - fFirstDayOfWeek;
        break;
    case UCAL_DOW_LOCAL:
        dowLocal = internalGet(UCAL_DOW_LOCAL) - 1;
        break;
    default:
        break;
    }
    dowLocal = dowLocal % 7;
    if (dowLocal < 0) {
        dowLocal += 7;
    }
    return dowLocal;
}